

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O3

void __thiscall
QHttp2ProtocolHandler::finishStream
          (QHttp2ProtocolHandler *this,QHttp2Stream *stream,ConnectionType connectionType)

{
  byte bVar1;
  long lVar2;
  ContextType *object;
  QDebug QVar3;
  int iVar4;
  QLoggingCategory *pQVar5;
  QHttpNetworkRequestPrivate *pQVar6;
  long lVar7;
  long lVar8;
  QSharedDataPointer<QHttpNetworkRequestPrivate> *this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QDebug local_80;
  QHttp2Stream *local_78;
  QArrayData *local_70;
  undefined8 local_68;
  QMetaMethodReturnArgument local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = stream;
  if (stream->m_state != Closed) {
    QHttp2Stream::sendRST_STREAM((QHttp2Stream *)stream,CANCEL);
  }
  QHash<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>::
  tryEmplace_impl<QHttp2Stream*const&>
            ((TryEmplaceResult *)&local_58,
             (QHash<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>> *)(this + 0x50)
             ,&local_78);
  lVar8 = *(long *)(CONCAT44(local_58.metaType._4_4_,local_58.metaType._0_4_) + 0x20);
  lVar7 = (CONCAT44(local_58.name._4_4_,(uint)local_58.name) >> 7) * 0x90;
  lVar2 = *(long *)(lVar8 + 0x80 + lVar7);
  bVar1 = *(byte *)((ulong)((uint)local_58.name & 0x7f) + lVar8 + lVar7);
  object = *(ContextType **)(lVar2 + 0x18 + (ulong)bVar1 * 0x20);
  if (object != (ContextType *)0x0) {
    iVar4 = QHttpNetworkReply::statusCode((QHttpNetworkReply *)object);
    if ((iVar4 == 0x197) || (iVar4 == 0x191)) {
      handleAuthorization(this,local_78);
    }
    else {
      QObject::disconnect(&object->super_QObject,(char *)0x0,(QObject *)this,(char *)0x0);
      lVar8 = (ulong)bVar1 * 0x20;
      pQVar6 = *(QHttpNetworkRequestPrivate **)(lVar2 + 0x10 + lVar8);
      if ((__int_type)
          (pQVar6->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> != 1) {
        this_00 = (QSharedDataPointer<QHttpNetworkRequestPrivate> *)(lVar2 + lVar8 + 0x10);
        QSharedDataPointer<QHttpNetworkRequestPrivate>::detach_helper(this_00);
        pQVar6 = (this_00->d).ptr;
      }
      if (pQVar6->needResendWithCredentials == false) {
        if (connectionType == DirectConnection) {
          QHttpNetworkReply::finished((QHttpNetworkReply *)object);
        }
        else {
          local_70 = (QArrayData *)QHttpNetworkReply::finished;
          local_68 = 0;
          local_58.metaType._0_4_ = 0x2ca2d0;
          local_58.metaType._4_4_ = 0;
          local_58.name._0_4_ = 0;
          local_58.name._4_4_ = 0;
          local_58.data._0_4_ = 0;
          local_58.data._4_4_ = 0;
          QMetaObject::invokeMethodCallableHelper<void(QHttpNetworkReply::*)()>
                    (object,(offset_in_QHttpNetworkReply_to_subr *)&local_70,connectionType,
                     &local_58);
        }
      }
    }
    if ((iVar4 == 0x191) || (iVar4 == 0x197)) goto LAB_001f5696;
  }
  pQVar5 = QtPrivateLogging::QT_HTTP2();
  if (((pQVar5->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_40 = pQVar5->name;
    local_58.metaType._0_4_ = 2;
    local_58.metaType._4_4_ = 0;
    local_58.name._0_4_ = 0;
    local_58.name._4_4_ = 0;
    local_58.data._0_4_ = 0;
    local_58.data._4_4_ = 0;
    QMessageLogger::debug();
    QVar3.stream = local_80.stream;
    QVar9.m_data = (storage_type *)0x6;
    QVar9.m_size = (qsizetype)&local_70;
    QString::fromUtf8(QVar9);
    QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)&local_70);
    if (local_70 != (QArrayData *)0x0) {
      LOCK();
      (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_70,2,0x10);
      }
    }
    if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_80.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_80.stream,local_78->m_streamID);
    if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_80.stream,' ');
    }
    QVar3.stream = local_80.stream;
    QVar10.m_data = (storage_type *)0x6;
    QVar10.m_size = (qsizetype)&local_70;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)&local_70);
    if (local_70 != (QArrayData *)0x0) {
      LOCK();
      (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_70,2,0x10);
      }
    }
    if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_80.stream,' ');
    }
    QDebug::~QDebug(&local_80);
  }
  QObject::deleteLater();
LAB_001f5696:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2ProtocolHandler::finishStream(QHttp2Stream *stream, Qt::ConnectionType connectionType)
{
    if (stream->state() != QHttp2Stream::State::Closed)
        stream->sendRST_STREAM(CANCEL);

    auto &pair = requestReplyPairs[stream];
    auto *httpReply = pair.second;
    if (httpReply) {
        int statusCode = httpReply->statusCode();
        if (statusCode == 401 || statusCode == 407) {
            // handleAuthorization will either re-send the request or
            // finishWithError. In either case we don't want to emit finished
            // here.
            handleAuthorization(stream);
            return;
        }

        httpReply->disconnect(this);

        if (!pair.first.d->needResendWithCredentials) {
            if (connectionType == Qt::DirectConnection)
                emit httpReply->finished();
            else
                QMetaObject::invokeMethod(httpReply, &QHttpNetworkReply::finished, connectionType);
        }
    }

    qCDebug(QT_HTTP2) << "stream" << stream->streamID() << "closed";
    stream->deleteLater();
}